

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O1

bool __thiscall QXmlUtils::isEncName(QXmlUtils *this,QStringView encName)

{
  ushort uVar1;
  CutResult CVar2;
  qsizetype qVar3;
  ushort *puVar4;
  long lVar5;
  uint uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  qsizetype local_20;
  qsizetype local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this == (QXmlUtils *)0x0) || (0x19 < (*(ushort *)encName.m_size & 0xffffffdf) - 0x41)) {
    bVar7 = false;
  }
  else {
    local_18 = 1;
    local_20 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid((qsizetype)this,&local_18,&local_20);
    if (CVar2 == Null) {
      qVar3 = 0;
      puVar4 = (ushort *)0x0;
    }
    else {
      puVar4 = (ushort *)encName.m_size + local_18;
      qVar3 = local_20;
    }
    bVar7 = qVar3 == 0;
    if (!bVar7) {
      lVar5 = 0;
      do {
        uVar1 = *(ushort *)((long)puVar4 + lVar5);
        if (((9 < uVar1 - 0x30) && (0x19 < (uVar1 & 0xffffffdf) - 0x41)) &&
           ((uVar6 = uVar1 - 0x2d, 0x32 < uVar6 ||
            ((0x4000000000003U >> ((ulong)uVar6 & 0x3f) & 1) == 0)))) break;
        lVar5 = lVar5 + 2;
        bVar7 = qVar3 * 2 == lVar5;
      } while (!bVar7);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QXmlUtils::isEncName(QStringView encName)
{
    // Valid encoding names are given by "[A-Za-z][A-Za-z0-9._\\-]*"
    if (encName.isEmpty())
        return false;
    const auto first = encName.front().unicode();
    if (!(isAsciiLower(first) || isAsciiUpper(first)))
        return false;
    for (QChar ch : encName.mid(1)) {
        const auto cp = ch.unicode();
        if (isAsciiLetterOrNumber(cp) || cp == '.' || cp == '_' || cp == '-')
            continue;
        return false;
    }
    return true;
}